

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkGetMultiRefNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_20;
  int local_1c;
  int i;
  int nNodes;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xe3,"int Abc_NtkGetMultiRefNum(Abc_Ntk_t *)");
  }
  local_1c = 0;
  for (local_20 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_20 < iVar1; local_20 = local_20 + 1) {
    pObj = Abc_NtkObj(pNtk,local_20);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      iVar1 = Abc_ObjFanoutNum(pObj);
      local_1c = (uint)(1 < iVar1) + local_1c;
    }
  }
  return local_1c;
}

Assistant:

int Abc_NtkGetMultiRefNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int nNodes, i;
    assert( Abc_NtkIsStrash(pNtk) );
    nNodes = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        nNodes += (int)(Abc_ObjFanoutNum(pNode) > 1);
    return nNodes;
}